

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.hxx
# Opt level: O2

void miniros::serialization::Serializer<rosgraph_msgs::Log_<std::allocator<void>>>::
     allInOne<miniros::serialization::LStream,rosgraph_msgs::Log_<std::allocator<void>>const&>
               (LStream *stream,Log_<std::allocator<void>_> *m)

{
  uint32_t uVar1;
  
  stream->count_ =
       (int)(m->header).frame_id._M_string_length + stream->count_ + (int)(m->name)._M_string_length
       + (int)(m->msg)._M_string_length + (int)(m->file)._M_string_length +
       (int)(m->function)._M_string_length + 0x25;
  uVar1 = VectorSerializer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
          ::serializedLength(&m->topics);
  stream->count_ = stream->count_ + uVar1;
  return;
}

Assistant:

inline static void allInOne(Stream& stream, T m)
    {
      stream.next(m.header);
      stream.next(m.level);
      stream.next(m.name);
      stream.next(m.msg);
      stream.next(m.file);
      stream.next(m.function);
      stream.next(m.line);
      stream.next(m.topics);
    }